

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

void mp_clamp(mp_int *a)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = a->used;
  if ((int)uVar2 < 1) {
    if (uVar2 != 0) {
      return;
    }
  }
  else {
    do {
      if (a->dp[(ulong)uVar2 - 1] != 0) {
        return;
      }
      a->used = uVar2 - 1;
      bVar1 = 1 < (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
  }
  a->sign = 0;
  return;
}

Assistant:

void mp_clamp (mp_int * a)
{
  /* decrease used while the most significant digit is
   * zero.
   */
  while (a->used > 0 && a->dp[a->used - 1] == 0) {
    --(a->used);
  }

  /* reset the sign flag if used == 0 */
  if (a->used == 0) {
    a->sign = MP_ZPOS;
  }
}